

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_response.cc
# Opt level: O0

void __thiscall RemoveResponse::RemoveResponse(RemoveResponse *this)

{
  FileInfo *pFVar1;
  undefined8 *in_RDI;
  FileInfo *in_stack_ffffffffffffffb8;
  NamenodeResponse *in_stack_ffffffffffffffc0;
  shared_ptr<FileInfo> *this_00;
  
  NamenodeResponse::NamenodeResponse(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR_Update_0018f928;
  pFVar1 = (FileInfo *)operator_new(0x38);
  FileInfo::FileInfo(pFVar1);
  std::shared_ptr<FileInfo>::shared_ptr<FileInfo,void>
            ((shared_ptr<FileInfo> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this_00 = (shared_ptr<FileInfo> *)(in_RDI + 4);
  pFVar1 = (FileInfo *)operator_new(0x38);
  FileInfo::FileInfo(pFVar1);
  std::shared_ptr<FileInfo>::shared_ptr<FileInfo,void>(this_00,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

RemoveResponse::RemoveResponse()
    : NamenodeResponse(), file_info_(new FileInfo()),
      parent_info_(new FileInfo()) {}